

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_utf8.c
# Opt level: O1

int u8_utf8toucs2(uint16_t *dest,int sz,char *src,int srcsz)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  short sVar5;
  short sVar7;
  byte *pbVar8;
  ushort uVar9;
  short sVar6;
  
  uVar3 = 0;
  if (1 < sz) {
    pbVar8 = (byte *)(src + srcsz);
    uVar4 = 0;
    do {
      bVar1 = *src;
      bVar2 = ""[bVar1];
      if (srcsz == -1) {
        if (bVar1 == 0) goto LAB_00178fc4;
      }
      else if (pbVar8 <= (byte *)src + (char)bVar2) goto LAB_00178fc4;
      sVar6 = 0;
      sVar5 = 0;
      sVar7 = 0;
      switch(bVar2) {
      case 0:
        uVar9 = (ushort)bVar2;
        break;
      case 3:
        src = (char *)((byte *)src + 1);
        sVar7 = (ushort)bVar1 << 6;
      case 2:
        bVar1 = *src;
        src = (char *)((byte *)src + 1);
        sVar6 = ((ushort)bVar1 + sVar7) * 0x40;
      case 1:
        bVar1 = *src;
        src = (char *)((byte *)src + 1);
        uVar9 = ((ushort)bVar1 + sVar6) * 0x40;
        break;
      default:
        goto switchD_00178f77_default;
      }
      bVar1 = *src;
      src = (char *)((byte *)src + 1);
      sVar5 = bVar1 + uVar9;
switchD_00178f77_default:
      dest[uVar4] = sVar5 - (short)offsetsFromUTF8[(char)bVar2];
      uVar4 = uVar4 + 1;
    } while (sz - 1U != uVar4);
    uVar4 = (ulong)(sz - 1U);
LAB_00178fc4:
    uVar3 = (uint)uVar4;
  }
  dest[uVar3] = 0;
  return uVar3;
}

Assistant:

int u8_utf8toucs2(uint16_t *dest, int sz, const char *src, int srcsz)
{
    uint16_t ch;
    const char *src_end = src + srcsz;
    int nb;
    int i=0;

    while (i < sz-1) {
        nb = trailingBytesForUTF8[(unsigned char)*src];
        if (srcsz == -1) {
            if (*src == 0)
                goto done_toucs;
        }
        else {
            if (src + nb >= src_end)
                goto done_toucs;
        }
        ch = 0;
        switch (nb) {
        case 3: ch += (unsigned char)*src++; ch <<= 6; /* falls through */
        case 2: ch += (unsigned char)*src++; ch <<= 6; /* falls through */
        case 1: ch += (unsigned char)*src++; ch <<= 6; /* falls through */
        case 0: ch += (unsigned char)*src++; /* falls through */
        }
        ch -= offsetsFromUTF8[nb];
        dest[i++] = ch;
    }
 done_toucs:
    dest[i] = 0;
    return i;
}